

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O3

void __thiscall
spdlog::details::c_formatter<spdlog::details::null_scoped_padder>::format
          (c_formatter<spdlog::details::null_scoped_padder> *this,log_msg *param_1,tm *tm_time,
          memory_buf_t *dest)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  size_t sVar4;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  ulong uVar8;
  char *buf_ptr;
  ptrdiff_t _Num;
  size_t sVar9;
  ulong uVar10;
  format_int local_50;
  
  pcVar6 = *(char **)(days + (long)tm_time->tm_wday * 8);
  sVar4 = strlen(pcVar6);
  sVar9 = (dest->super_buffer<char>).size_;
  if (pcVar6 != (char *)0x0) {
    sVar9 = sVar9 + sVar4;
    if ((dest->super_buffer<char>).capacity_ < sVar9) {
      (**(dest->super_buffer<char>)._vptr_buffer)(dest,sVar9);
    }
    if (sVar4 != 0) {
      memmove((dest->super_buffer<char>).ptr_ + (dest->super_buffer<char>).size_,pcVar6,sVar4);
    }
    (dest->super_buffer<char>).size_ = sVar9;
  }
  uVar10 = sVar9 + 1;
  if ((dest->super_buffer<char>).capacity_ < uVar10) {
    (**(dest->super_buffer<char>)._vptr_buffer)(dest);
    sVar9 = (dest->super_buffer<char>).size_;
    uVar10 = sVar9 + 1;
  }
  (dest->super_buffer<char>).size_ = uVar10;
  (dest->super_buffer<char>).ptr_[sVar9] = ' ';
  pcVar6 = *(char **)(months + (long)tm_time->tm_mon * 8);
  sVar4 = strlen(pcVar6);
  sVar9 = (dest->super_buffer<char>).size_;
  uVar10 = (dest->super_buffer<char>).capacity_;
  if (pcVar6 != (char *)0x0) {
    sVar9 = sVar9 + sVar4;
    if (uVar10 < sVar9) {
      (**(dest->super_buffer<char>)._vptr_buffer)(dest,sVar9);
    }
    if (sVar4 != 0) {
      memmove((dest->super_buffer<char>).ptr_ + (dest->super_buffer<char>).size_,pcVar6,sVar4);
    }
    (dest->super_buffer<char>).size_ = sVar9;
    uVar10 = (dest->super_buffer<char>).capacity_;
  }
  uVar8 = sVar9 + 1;
  if (uVar10 < uVar8) {
    (**(dest->super_buffer<char>)._vptr_buffer)(dest);
    sVar9 = (dest->super_buffer<char>).size_;
    uVar8 = sVar9 + 1;
  }
  (dest->super_buffer<char>).size_ = uVar8;
  (dest->super_buffer<char>).ptr_[sVar9] = ' ';
  uVar1 = tm_time->tm_mday;
  uVar3 = -uVar1;
  if (0 < (int)uVar1) {
    uVar3 = uVar1;
  }
  pcVar5 = fmt::v6::format_int::format_decimal(&local_50,(ulong)uVar3);
  pcVar6 = pcVar5;
  if ((int)uVar1 < 0) {
    pcVar6 = pcVar5 + -1;
    pcVar5[-1] = '-';
  }
  pcVar5 = local_50.buffer_ + 0x15;
  sVar9 = (dest->super_buffer<char>).size_ + ((long)pcVar5 - (long)pcVar6);
  local_50.str_ = pcVar6;
  if ((dest->super_buffer<char>).capacity_ < sVar9) {
    (**(dest->super_buffer<char>)._vptr_buffer)(dest,sVar9);
  }
  if (pcVar5 != pcVar6) {
    memmove((dest->super_buffer<char>).ptr_ + (dest->super_buffer<char>).size_,pcVar6,
            (long)pcVar5 - (long)pcVar6);
  }
  (dest->super_buffer<char>).size_ = sVar9;
  uVar10 = sVar9 + 1;
  if ((dest->super_buffer<char>).capacity_ < uVar10) {
    (**(dest->super_buffer<char>)._vptr_buffer)(dest);
    sVar9 = (dest->super_buffer<char>).size_;
    uVar10 = sVar9 + 1;
  }
  (dest->super_buffer<char>).size_ = uVar10;
  (dest->super_buffer<char>).ptr_[sVar9] = ' ';
  fmt_helper::pad2(tm_time->tm_hour,dest);
  sVar9 = (dest->super_buffer<char>).size_;
  uVar10 = sVar9 + 1;
  if ((dest->super_buffer<char>).capacity_ < uVar10) {
    (**(dest->super_buffer<char>)._vptr_buffer)(dest);
    sVar9 = (dest->super_buffer<char>).size_;
    uVar10 = sVar9 + 1;
  }
  (dest->super_buffer<char>).size_ = uVar10;
  (dest->super_buffer<char>).ptr_[sVar9] = ':';
  fmt_helper::pad2(tm_time->tm_min,dest);
  sVar9 = (dest->super_buffer<char>).size_;
  uVar10 = sVar9 + 1;
  if ((dest->super_buffer<char>).capacity_ < uVar10) {
    (**(dest->super_buffer<char>)._vptr_buffer)(dest);
    sVar9 = (dest->super_buffer<char>).size_;
    uVar10 = sVar9 + 1;
  }
  (dest->super_buffer<char>).size_ = uVar10;
  (dest->super_buffer<char>).ptr_[sVar9] = ':';
  fmt_helper::pad2(tm_time->tm_sec,dest);
  sVar9 = (dest->super_buffer<char>).size_;
  uVar10 = sVar9 + 1;
  if ((dest->super_buffer<char>).capacity_ < uVar10) {
    (**(dest->super_buffer<char>)._vptr_buffer)(dest);
    sVar9 = (dest->super_buffer<char>).size_;
    uVar10 = sVar9 + 1;
  }
  (dest->super_buffer<char>).size_ = uVar10;
  (dest->super_buffer<char>).ptr_[sVar9] = ' ';
  iVar2 = tm_time->tm_year;
  uVar1 = iVar2 + 0x76c;
  uVar3 = -uVar1;
  if (0 < (int)uVar1) {
    uVar3 = uVar1;
  }
  pcVar7 = fmt::v6::format_int::format_decimal(&local_50,(ulong)uVar3);
  pcVar6 = pcVar7;
  if (iVar2 < -0x76c) {
    pcVar6 = pcVar7 + -1;
    pcVar7[-1] = '-';
  }
  uVar10 = (dest->super_buffer<char>).size_ + ((long)pcVar5 - (long)pcVar6);
  local_50.str_ = pcVar6;
  if ((dest->super_buffer<char>).capacity_ < uVar10) {
    (**(dest->super_buffer<char>)._vptr_buffer)(dest,uVar10);
  }
  if (pcVar5 != pcVar6) {
    memmove((dest->super_buffer<char>).ptr_ + (dest->super_buffer<char>).size_,pcVar6,
            (long)pcVar5 - (long)pcVar6);
  }
  (dest->super_buffer<char>).size_ = uVar10;
  return;
}

Assistant:

void format(const details::log_msg &, const std::tm &tm_time, memory_buf_t &dest) override
    {
        const size_t field_size = 24;
        ScopedPadder p(field_size, padinfo_, dest);

        fmt_helper::append_string_view(days[static_cast<size_t>(tm_time.tm_wday)], dest);
        dest.push_back(' ');
        fmt_helper::append_string_view(months[static_cast<size_t>(tm_time.tm_mon)], dest);
        dest.push_back(' ');
        fmt_helper::append_int(tm_time.tm_mday, dest);
        dest.push_back(' ');
        // time

        fmt_helper::pad2(tm_time.tm_hour, dest);
        dest.push_back(':');
        fmt_helper::pad2(tm_time.tm_min, dest);
        dest.push_back(':');
        fmt_helper::pad2(tm_time.tm_sec, dest);
        dest.push_back(' ');
        fmt_helper::append_int(tm_time.tm_year + 1900, dest);
    }